

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O2

void secp256k1_hmac_sha256_finalize(secp256k1_hmac_sha256 *hash,uchar *out32)

{
  uchar temp [32];
  
  secp256k1_sha256_finalize(&hash->inner,temp);
  secp256k1_sha256_write(&hash->outer,temp,0x20);
  temp[0x10] = '\0';
  temp[0x11] = '\0';
  temp[0x12] = '\0';
  temp[0x13] = '\0';
  temp[0x14] = '\0';
  temp[0x15] = '\0';
  temp[0x16] = '\0';
  temp[0x17] = '\0';
  temp[0x18] = '\0';
  temp[0x19] = '\0';
  temp[0x1a] = '\0';
  temp[0x1b] = '\0';
  temp[0x1c] = '\0';
  temp[0x1d] = '\0';
  temp[0x1e] = '\0';
  temp[0x1f] = '\0';
  temp[0] = '\0';
  temp[1] = '\0';
  temp[2] = '\0';
  temp[3] = '\0';
  temp[4] = '\0';
  temp[5] = '\0';
  temp[6] = '\0';
  temp[7] = '\0';
  temp[8] = '\0';
  temp[9] = '\0';
  temp[10] = '\0';
  temp[0xb] = '\0';
  temp[0xc] = '\0';
  temp[0xd] = '\0';
  temp[0xe] = '\0';
  temp[0xf] = '\0';
  secp256k1_sha256_finalize(&hash->outer,out32);
  return;
}

Assistant:

static void secp256k1_hmac_sha256_finalize(secp256k1_hmac_sha256 *hash, unsigned char *out32) {
    unsigned char temp[32];
    secp256k1_sha256_finalize(&hash->inner, temp);
    secp256k1_sha256_write(&hash->outer, temp, 32);
    secp256k1_memclear(temp, sizeof(temp));
    secp256k1_sha256_finalize(&hash->outer, out32);
}